

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abc.c
# Opt level: O3

int Abc_CommandAbc9Show(Abc_Frame_t *pAbc,int argc,char **argv)

{
  int iVar1;
  Vec_Int_t *vBold;
  int *__ptr;
  uint uVar2;
  char *pcVar3;
  long lVar4;
  Gia_Man_t *pMan;
  
  uVar2 = 0;
  Extra_UtilGetoptReset();
  while (iVar1 = Extra_UtilGetopt(argc,argv,"ah"), iVar1 == 0x61) {
    uVar2 = uVar2 ^ 1;
  }
  if (iVar1 == -1) {
    pMan = pAbc->pGia;
    if (pMan == (Gia_Man_t *)0x0) {
      pcVar3 = "Abc_CommandAbc9Show(): There is no AIG.\n";
    }
    else {
      if (pMan->nBufs == 0) {
        if ((uVar2 != 0) || (pMan->vMapping == (Vec_Int_t *)0x0)) {
          Gia_ManShow(pMan,(Vec_Int_t *)0x0,uVar2);
          return 0;
        }
        vBold = (Vec_Int_t *)malloc(0x10);
        vBold->nCap = 100;
        vBold->nSize = 0;
        __ptr = (int *)malloc(400);
        vBold->pArray = __ptr;
        if (1 < pMan->nObjs) {
          lVar4 = 1;
          do {
            if (pMan->vMapping->nSize <= lVar4) {
              __assert_fail("i >= 0 && i < p->nSize",
                            "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecInt.h"
                            ,0x19e,"int Vec_IntEntry(Vec_Int_t *, int)");
            }
            if (pMan->vMapping->pArray[lVar4] != 0) {
              uVar2 = vBold->nSize;
              if (uVar2 == vBold->nCap) {
                if ((int)uVar2 < 0x10) {
                  if (__ptr == (int *)0x0) {
                    __ptr = (int *)malloc(0x40);
                  }
                  else {
                    __ptr = (int *)realloc(__ptr,0x40);
                  }
                  vBold->pArray = __ptr;
                  iVar1 = 0x10;
                  if (__ptr == (int *)0x0) {
LAB_0022852e:
                    __assert_fail("p->pArray",
                                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecInt.h"
                                  ,0x20c,"void Vec_IntGrow(Vec_Int_t *, int)");
                  }
                }
                else {
                  if (__ptr == (int *)0x0) {
                    __ptr = (int *)malloc((ulong)uVar2 * 8);
                  }
                  else {
                    __ptr = (int *)realloc(__ptr,(ulong)uVar2 * 8);
                  }
                  vBold->pArray = __ptr;
                  if (__ptr == (int *)0x0) goto LAB_0022852e;
                  iVar1 = uVar2 * 2;
                }
                vBold->nCap = iVar1;
              }
              iVar1 = vBold->nSize;
              vBold->nSize = iVar1 + 1;
              __ptr[iVar1] = (int)lVar4;
              pMan = pAbc->pGia;
            }
            lVar4 = lVar4 + 1;
          } while (lVar4 < pMan->nObjs);
        }
        Gia_ManShow(pMan,vBold,0);
        if (vBold->pArray != (int *)0x0) {
          free(vBold->pArray);
        }
        free(vBold);
        return 0;
      }
      pcVar3 = "Abc_CommandAbc9Show(): Cannot show GIA with barrier buffers.\n";
    }
    iVar1 = -1;
  }
  else {
    Abc_Print(-2,"usage: &show [-ah]\n");
    Abc_Print(-2,"\t        shows the current GIA using GSView\n");
    pcVar3 = "yes";
    if (uVar2 == 0) {
      pcVar3 = "no";
    }
    Abc_Print(-2,"\t-a    : toggle visualazing adders [default = %s]\n",pcVar3);
    pcVar3 = "\t-h    : print the command usage\n";
    iVar1 = -2;
  }
  Abc_Print(iVar1,pcVar3);
  return 1;
}

Assistant:

int Abc_CommandAbc9Show( Abc_Frame_t * pAbc, int argc, char ** argv )
{
    Vec_Int_t * vBold = NULL;
    int c, fAdders = 0;
    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "ah" ) ) != EOF )
    {
        switch ( c )
        {
        case 'a':
            fAdders ^= 1;
            break;
        case 'h':
            goto usage;
        default:
            goto usage;
        }
    }
    if ( pAbc->pGia == NULL )
    {
        Abc_Print( -1, "Abc_CommandAbc9Show(): There is no AIG.\n" );
        return 1;
    }
    if ( Gia_ManBufNum(pAbc->pGia) )
    {
        Abc_Print( -1, "Abc_CommandAbc9Show(): Cannot show GIA with barrier buffers.\n" );
        return 1;
    }
    if ( !fAdders && Gia_ManHasMapping(pAbc->pGia) )
    {
        vBold = Vec_IntAlloc( 100 );
        Gia_ManForEachLut( pAbc->pGia, c )
            Vec_IntPush( vBold, c );
    }
    Gia_ManShow( pAbc->pGia, vBold, fAdders );
    Vec_IntFreeP( &vBold );
    return 0;

usage:
    Abc_Print( -2, "usage: &show [-ah]\n" );
    Abc_Print( -2, "\t        shows the current GIA using GSView\n" );
    Abc_Print( -2, "\t-a    : toggle visualazing adders [default = %s]\n", fAdders? "yes": "no" );
    Abc_Print( -2, "\t-h    : print the command usage\n");
    return 1;
}